

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::emit_unary_op_cast
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,char *op)

{
  bool forwarding;
  SPIRType *pSVar1;
  char *op_local;
  string local_90;
  spirv_cross local_70 [32];
  string local_50;
  
  op_local = op;
  pSVar1 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,result_type);
  forwarding = should_forward(this,op0);
  (*(this->super_Compiler)._vptr_Compiler[0x13])(local_70,this,pSVar1,0);
  to_enclosed_unpacked_expression_abi_cxx11_(&local_90,this,op0,true);
  join<std::__cxx11::string,char_const(&)[2],char_const*&,std::__cxx11::string,char_const(&)[2]>
            (&local_50,local_70,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2c2359,
             (char (*) [2])&op_local,(char **)&local_90,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2cdc84,
             (char (*) [2])op_local);
  emit_op(this,result_type,result_id,&local_50,forwarding,false);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)local_70);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op0);
  return;
}

Assistant:

void CompilerGLSL::emit_unary_op_cast(uint32_t result_type, uint32_t result_id, uint32_t op0, const char *op)
{
	auto &type = get<SPIRType>(result_type);
	bool forward = should_forward(op0);
	emit_op(result_type, result_id, join(type_to_glsl(type), "(", op, to_enclosed_unpacked_expression(op0), ")"), forward);
	inherit_expression_dependencies(result_id, op0);
}